

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void unruh_G_x4(picnic_instance_t *pp,proof_round_t *prf_round,uint vidx,_Bool include_is)

{
  int iVar1;
  byte in_CL;
  long in_RDI;
  uint outputlen;
  uint8_t tmp [4] [64];
  hash_context_x4 ctx;
  uint digest_size;
  undefined4 in_stack_fffffffffffffb98;
  undefined2 in_stack_fffffffffffffb9c;
  ushort uVar2;
  undefined2 in_stack_fffffffffffffb9e;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  size_t in_stack_fffffffffffffbb8;
  uint8_t *in_stack_fffffffffffffbc0;
  uint8_t *in_stack_fffffffffffffbc8;
  uint8_t *in_stack_fffffffffffffbd0;
  uint8_t *in_stack_fffffffffffffbd8;
  hash_context_x4 *in_stack_fffffffffffffbe0;
  
  hash_init_prefix_x4((hash_context_x4 *)
                      CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                      CONCAT26(in_stack_fffffffffffffb9e,
                               CONCAT24(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98)),'\0');
  hash_update_x4_4(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                   in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  hash_final_x4((hash_context_x4 *)0x139038);
  hash_squeeze_x4_4(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                    in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  hash_init_x4((hash_context_x4 *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               CONCAT26(in_stack_fffffffffffffb9e,
                        CONCAT24(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98)));
  hash_update_x4_4(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                   in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  if ((in_CL & 1) != 0) {
    hash_update_x4_4(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                     in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  }
  hash_update_x4_4(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                   in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  iVar1 = (uint)*(byte *)(in_RDI + 9) + (uint)*(byte *)(in_RDI + 8);
  if ((in_CL & 1) == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ushort)*(byte *)(in_RDI + 8);
  }
  hash_update_x4_uint16_le((hash_context_x4 *)CONCAT44(iVar1 + (uint)uVar2,iVar1),0);
  hash_final_x4((hash_context_x4 *)0x13922d);
  hash_squeeze_x4_4(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                    in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  return;
}

Assistant:

static void unruh_G_x4(const picnic_instance_t* pp, proof_round_t* prf_round, unsigned int vidx,
                       bool include_is) {

  const unsigned int digest_size = pp->digest_size;

  // Hash the seed with H_5, store digest in output
  hash_context_x4 ctx;
  hash_init_prefix_x4(&ctx, digest_size, HASH_PREFIX_5);
  hash_update_x4_4(&ctx, prf_round[0].seeds[vidx], prf_round[1].seeds[vidx],
                   prf_round[2].seeds[vidx], prf_round[3].seeds[vidx], pp->seed_size);
  hash_final_x4(&ctx);

  uint8_t tmp[4][MAX_DIGEST_SIZE];
  hash_squeeze_x4_4(&ctx, tmp[0], tmp[1], tmp[2], tmp[3], digest_size);
  hash_clear_x4(&ctx);

  // Hash H_5(seed), the view, and the length
  hash_init_x4(&ctx, digest_size);
  hash_update_x4_4(&ctx, tmp[0], tmp[1], tmp[2], tmp[3], digest_size);
  if (include_is) {
    hash_update_x4_4(&ctx, prf_round[0].input_shares[vidx], prf_round[1].input_shares[vidx],
                     prf_round[2].input_shares[vidx], prf_round[3].input_shares[vidx],
                     pp->input_output_size);
  }
  hash_update_x4_4(&ctx, prf_round[0].communicated_bits[vidx], prf_round[1].communicated_bits[vidx],
                   prf_round[2].communicated_bits[vidx], prf_round[3].communicated_bits[vidx],
                   pp->view_size);
  const unsigned int outputlen =
      pp->view_size + pp->input_output_size + (include_is ? pp->input_output_size : 0);
  hash_update_x4_uint16_le(&ctx, outputlen);
  hash_final_x4(&ctx);
  hash_squeeze_x4_4(&ctx, prf_round[0].gs[vidx], prf_round[1].gs[vidx], prf_round[2].gs[vidx],
                    prf_round[3].gs[vidx], outputlen);
  hash_clear_x4(&ctx);
}